

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::ReadMalformedModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  undefined8 uVar1;
  undefined1 local_88 [8];
  Errors errors;
  undefined1 local_58 [8];
  string header;
  char *desc_local;
  ModuleType module_type_local;
  int line_number_local;
  CommandRunner *this_local;
  string_view module_filename_local;
  Result result;
  
  header.field_2._8_8_ = desc;
  uVar1 = std::__cxx11::string::c_str();
  wabt::StringPrintf_abi_cxx11_
            ((string *)local_58,"%s:%d: %s passed",uVar1,(ulong)(uint)line_number);
  if (module_type == Text) {
    module_filename_local._M_str._4_4_ =
         ReadTextModule(this,module_filename,(string *)local_58,false);
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    if (module_type != Binary) {
      abort();
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_88);
    module_filename_local._M_str._4_4_ =
         ReadMalformedBinaryModule(this,module_filename,(Errors *)local_88);
    wabt::FormatErrorsToFile
              ((Errors *)local_88,Binary,(LexerSourceLineFinder *)0x0,_stdout,(string *)local_58,
               Once,0x50);
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_88);
  }
  std::__cxx11::string::~string((string *)local_58);
  return (Result)module_filename_local._M_str._4_4_;
}

Assistant:

wabt::Result CommandRunner::ReadMalformedModule(
    int line_number,
    std::string_view module_filename,
    ModuleType module_type,
    const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadTextModule(module_filename, header, false);
    }

    case ModuleType::Binary: {
      Errors errors;
      wabt::Result result = ReadMalformedBinaryModule(module_filename, &errors);
      FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                         PrintHeader::Once);
      return result;
    }
  }

  WABT_UNREACHABLE;
}